

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  ImVec2 IVar1;
  ImGuiDockNode *pIVar2;
  byte bVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ushort uVar7;
  ImGuiWindow *pIVar8;
  ImGuiDockNodeFlags *pIVar9;
  float *pfVar10;
  ImGuiWindow *pIVar11;
  ushort uVar12;
  uint uVar13;
  ImVec2 *pIVar14;
  ImVec2 *pIVar15;
  long lVar16;
  ulong idx;
  ulong idx_00;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ImRect IVar26;
  ImVec2 *local_88;
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_60;
  ImVec2 *local_58;
  ImVec2 pos_old;
  ImVec2 size_old;
  
  pIVar5 = GImGui;
  pIVar2 = root_payload->DockNodeAsHost;
  pIVar11 = host_window;
  if (host_node != (ImGuiDockNode *)0x0) {
    uVar13 = *(uint *)&host_node->field_0xc4;
    pIVar8 = (ImGuiWindow *)host_node;
    if ((uVar13 >> 9 & 1) == 0) {
      pIVar8 = (ImGuiWindow *)DockNodeGetRootNode((ImGuiDockNode *)GImGui);
      if (pIVar8 == (ImGuiWindow *)0x0) goto LAB_0015aec4;
      uVar13 = (uint)*(ushort *)&(pIVar8->ScrollbarSizes).y;
    }
    pIVar11 = pIVar8;
    if ((uVar13 >> 9 & 1) == 0) {
      __assert_fail("ref_node_for_rect->IsVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x3d34,
                    "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                   );
    }
  }
LAB_0015aec4:
  pIVar9 = &pIVar2->MergedFlags;
  if (pIVar2 == (ImGuiDockNode *)0x0) {
    pIVar9 = &(root_payload->WindowClass).DockNodeFlagsOverrideSet;
  }
  uVar13 = *pIVar9;
  pIVar9 = &(host_window->WindowClass).DockNodeFlagsOverrideSet;
  if (host_node != (ImGuiDockNode *)0x0) {
    pIVar9 = &host_node->MergedFlags;
  }
  uVar17 = *pIVar9;
  data->IsCenterAvailable = true;
  if ((uVar17 & 0x10000) != 0 || is_outer_docking) {
LAB_0015afab:
    data->IsCenterAvailable = false;
  }
  else {
    if (((byte)((uVar17 & 4) >> 2) & host_node != (ImGuiDockNode *)0x0) == 1) {
      if ((host_node->MergedFlags & 0x800) == 0) goto LAB_0015af2a;
      goto LAB_0015afab;
    }
    if (host_node == (ImGuiDockNode *)0x0) {
      if (pIVar2 == (ImGuiDockNode *)0x0) goto LAB_0015af6f;
LAB_0015af4d:
      if (pIVar2->ChildNodes[0] == (ImGuiDockNode *)0x0) goto LAB_0015af6f;
      if (pIVar2->OnlyNodeWithWindows == (ImGuiDockNode *)0x0 || (uVar17 >> 0x13 & 1) != 0)
      goto LAB_0015afab;
    }
    else {
LAB_0015af2a:
      if ((pIVar2 != (ImGuiDockNode *)0x0) &&
         (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0 || (host_node->Windows).Size != 0))
      goto LAB_0015af4d;
LAB_0015af6f:
      if ((uVar17 >> 0x13 & 1) != 0) goto LAB_0015afab;
    }
    if ((((uVar13 >> 0x14 & 1) != 0) &&
        (((host_node == (ImGuiDockNode *)0x0 || (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0))
         || ((host_node->Windows).Size != 0)))) ||
       ((((host_node != (ImGuiDockNode *)0x0 && ((uVar13 & 0x200000) != 0)) &&
         (host_node->ChildNodes[0] == (ImGuiDockNode *)0x0)) && ((host_node->Windows).Size == 0))))
    goto LAB_0015afab;
  }
  data->IsSidesAvailable = true;
  if (((uVar17 & 0x10) == 0) && ((pIVar5->IO).ConfigDockingNoSplit == false)) {
    if ((host_node == (ImGuiDockNode *)0x0 || is_outer_docking) ||
       ((host_node->ParentNode != (ImGuiDockNode *)0x0 || ((host_node->MergedFlags & 0x800) == 0))))
    {
      if ((uVar13 & 0x40000) != 0 || (uVar17 & 0x20000) != 0) goto LAB_0015aff5;
      goto LAB_0015affc;
    }
    data->IsSidesAvailable = false;
LAB_0015b005:
    bVar3 = host_node->field_0xc5 & 0x10;
  }
  else {
LAB_0015aff5:
    data->IsSidesAvailable = false;
LAB_0015affc:
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_0015b005;
    bVar3 = host_window->HasCloseButton;
  }
  uVar7 = 0x1000;
  if (bVar3 == 0) {
    uVar7 = (ushort)root_payload->HasCloseButton << 0xc;
  }
  uVar7 = uVar7 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xc4 & 0xefff;
  *(ushort *)&(data->FutureNode).field_0xc4 = uVar7;
  uVar12 = 0x2000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar12 = (ushort)((~host_window->Flags & 0x20U) << 8);
  }
  *(ushort *)&(data->FutureNode).field_0xc4 = uVar12 | uVar7 & 0xdfff;
  (data->FutureNode).Pos = pIVar11->Pos;
  (data->FutureNode).Size = pIVar11->Size;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar13 = 0xffffffff;
    pIVar15 = &(pIVar5->IO).MousePos;
    for (lVar16 = 0xe0; lVar16 != 0x130; lVar16 = lVar16 + 0x10) {
      if (lVar16 == 0xe0) {
        if (data->IsCenterAvailable != false) {
LAB_0015b0e1:
          IVar26 = ImGuiDockNode::Rect(&data->FutureNode);
          fVar23 = IVar26.Max.x - IVar26.Min.x;
          fVar24 = IVar26.Max.y - IVar26.Min.y;
          fVar21 = fVar23;
          if (fVar24 <= fVar23) {
            fVar21 = fVar24;
          }
          fVar19 = GImGui->FontSize * 1.5;
          fVar25 = GImGui->FontSize * 0.5;
          uVar17 = -(uint)(fVar21 * 0.125 <= fVar25);
          fVar21 = (float)(uVar17 & (uint)fVar25 | ~uVar17 & (uint)(fVar21 * 0.125));
          if (fVar21 <= fVar19) {
            fVar19 = fVar21;
          }
          if (is_outer_docking) {
            fVar25 = (float)(int)(fVar19 * 0.8);
            fVar19 = (float)(int)(fVar19 * 1.5);
            fVar23 = (float)(int)(fVar23 * 0.5 - fVar25);
            fVar21 = (float)(int)(fVar24 * 0.5 - fVar25);
          }
          else {
            fVar25 = (float)(int)(fVar19 * 0.9);
            fVar19 = (float)(int)fVar19;
            fVar23 = (float)(int)(fVar19 * 2.4);
            fVar21 = fVar23;
          }
          pIVar14 = (ImVec2 *)((long)(data->FutureNode).ChildNodes + lVar16 + -0x20);
          fVar24 = (float)(int)((IVar26.Min.x + IVar26.Max.x) * 0.5);
          fVar18 = (float)(int)((IVar26.Min.y + IVar26.Max.y) * 0.5);
          if (lVar16 == 0xe0) {
            fVar20 = fVar24 - fVar19;
            fVar22 = fVar18 - fVar19;
            fVar23 = fVar24 + fVar19;
            fVar25 = fVar18 + fVar19;
LAB_0015b1da:
            pIVar14->x = fVar20;
            pIVar14->y = fVar22;
            pIVar14[1].x = fVar23;
            pIVar14[1].y = fVar25;
          }
          else if (uVar13 < 4) {
            switch(uVar13) {
            case 0:
              fVar20 = (fVar24 - fVar23) - fVar25;
              fVar22 = fVar18 - fVar19;
              fVar23 = (fVar24 - fVar23) + fVar25;
              fVar25 = fVar18 + fVar19;
              break;
            case 1:
              fVar20 = (fVar23 + fVar24) - fVar25;
              fVar22 = fVar18 - fVar19;
              fVar23 = fVar23 + fVar24 + fVar25;
              fVar25 = fVar18 + fVar19;
              break;
            case 2:
              fVar20 = fVar24 - fVar19;
              fVar22 = (fVar18 - fVar21) - fVar25;
              fVar23 = fVar19 + fVar24;
              fVar25 = fVar25 + (fVar18 - fVar21);
              break;
            case 3:
              fVar20 = fVar24 - fVar19;
              fVar22 = (fVar21 + fVar18) - fVar25;
              fVar23 = fVar19 + fVar24;
              fVar25 = fVar25 + fVar21 + fVar18;
            }
            goto LAB_0015b1da;
          }
          local_78.Min = *pIVar14;
          local_78.Max.x = pIVar14[1].x;
          local_78.Max.y = pIVar14[1].y;
          if (is_outer_docking) {
LAB_0015b1eb:
            bVar6 = ImRect::Contains(&local_78,pIVar15);
            if (bVar6) {
LAB_0015b1fc:
              data->SplitDir = uVar13;
              data->IsSplitDirExplicit = true;
            }
          }
          else {
            fVar21 = (float)(int)(fVar19 * 0.3);
            local_78.Max.x = fVar21 + local_78.Max.x;
            local_78.Max.y = fVar21 + local_78.Max.y;
            local_78.Min.y = pIVar14->y - fVar21;
            local_78.Min.x = pIVar14->x - fVar21;
            IVar1 = *pIVar15;
            fVar24 = IVar1.x - fVar24;
            fVar18 = IVar1.y - fVar18;
            fVar21 = fVar24 * fVar24 + fVar18 * fVar18;
            if (fVar19 * 1.4 * fVar19 * 1.4 <= fVar21) {
              if (fVar19 * 2.6 * fVar19 * 2.6 <= fVar21) goto LAB_0015b1eb;
              uVar17 = (uint)(0.0 < fVar24);
              if (ABS(fVar24) <= ABS(fVar18)) {
                uVar17 = 0.0 < fVar18 | 2;
              }
              if (uVar13 == uVar17) goto LAB_0015b1fc;
            }
            else if (lVar16 == 0xe0) goto LAB_0015b1fc;
          }
        }
      }
      else if (data->IsSidesAvailable == true) goto LAB_0015b0e1;
      uVar13 = uVar13 + 1;
    }
    uVar13 = data->SplitDir;
    if (uVar13 == 0xffffffff) goto LAB_0015b38e;
    bVar6 = true;
    bVar4 = false;
  }
  else {
LAB_0015b38e:
    bVar6 = data->IsCenterAvailable;
    uVar13 = 0xffffffff;
    bVar4 = true;
  }
  data->IsDropAllowed = bVar6;
  if (((!is_explicit_target) && (data->IsSplitDirExplicit == false)) &&
     ((pIVar5->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (bVar4) {
    return;
  }
  idx_00 = (ulong)(uVar13 >= 2);
  idx = (ulong)(uVar13 < 2);
  local_80.x = 0.0;
  local_80.y = 0.0;
  pos_old = (data->FutureNode).Pos;
  local_88 = &pos_old;
  local_60.x = 0.0;
  local_60.y = 0.0;
  size_old = (data->FutureNode).Size;
  local_78.Min = root_payload->Size;
  fVar21 = (GImGui->Style).ItemInnerSpacing.x;
  pfVar10 = ImVec2::operator[](local_88,idx);
  fVar23 = *pfVar10;
  pfVar10 = ImVec2::operator[](&local_80,idx);
  *pfVar10 = fVar23;
  pfVar10 = ImVec2::operator[](&size_old,idx);
  fVar23 = *pfVar10;
  pfVar10 = ImVec2::operator[](&local_60,idx);
  *pfVar10 = fVar23;
  pfVar10 = ImVec2::operator[](&size_old,idx_00);
  fVar23 = *pfVar10 - fVar21;
  pfVar10 = ImVec2::operator[](&local_78.Min,idx_00);
  if ((*pfVar10 <= 0.0) ||
     (pfVar10 = ImVec2::operator[](&local_78.Min,idx_00), fVar23 * 0.5 < *pfVar10)) {
    fVar24 = (float)(int)(fVar23 * 0.5);
  }
  else {
    pfVar10 = ImVec2::operator[](&local_78.Min,idx_00);
    fVar24 = *pfVar10;
  }
  pIVar15 = &local_80;
  local_58 = &(data->FutureNode).Size;
  pfVar10 = ImVec2::operator[](&local_60,idx_00);
  *pfVar10 = fVar24;
  pfVar10 = ImVec2::operator[](&local_60,idx_00);
  fVar24 = *pfVar10;
  pfVar10 = ImVec2::operator[](&size_old,idx_00);
  *pfVar10 = (float)(int)(fVar23 - fVar24);
  uVar13 = uVar13 & 0xfffffffd;
  pIVar14 = &size_old;
  if (uVar13 != 1) {
    if (uVar13 != 0) goto LAB_0015b60e;
    pIVar15 = &pos_old;
    pfVar10 = ImVec2::operator[](pIVar15,idx_00);
    fVar23 = *pfVar10;
    local_88 = &local_80;
    pfVar10 = ImVec2::operator[](local_88,idx_00);
    *pfVar10 = fVar23;
    pIVar14 = &local_60;
  }
  pfVar10 = ImVec2::operator[](local_88,idx_00);
  fVar23 = *pfVar10;
  pfVar10 = ImVec2::operator[](pIVar14,idx_00);
  fVar24 = *pfVar10;
  pfVar10 = ImVec2::operator[](pIVar15,idx_00);
  *pfVar10 = fVar21 + fVar23 + fVar24;
LAB_0015b60e:
  pfVar10 = ImVec2::operator[](&local_60,idx_00);
  fVar21 = *pfVar10;
  pfVar10 = ImVec2::operator[](local_58,idx_00);
  fVar21 = fVar21 / *pfVar10;
  fVar23 = 1.0;
  if (fVar21 <= 1.0) {
    fVar23 = fVar21;
  }
  fVar23 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar23);
  (data->FutureNode).Pos = local_80;
  (data->FutureNode).Size = local_60;
  if (uVar13 == 1) {
    fVar23 = 1.0 - fVar23;
  }
  data->SplitRatio = fVar23;
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->MergedFlags : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->MergedFlags : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe)
        data->IsCenterAvailable = false;
    else if ((src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther) && (!host_node || !host_node->IsEmpty()))
        data->IsCenterAvailable = false;
    else if ((src_node_flags & ImGuiDockNodeFlags_NoDockingOverEmpty) && host_node && host_node->IsEmpty())
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}